

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLPostProcessor.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::PostProcessor::linkAndWriteFormulas(PostProcessor *this)

{
  bool bVar1;
  int iVar2;
  Formulas *this_00;
  undefined4 extraout_var;
  char *__to;
  UI_STRING *uis;
  DocumentProcessor *ui;
  DocumentProcessor *in_RDI;
  FormulasLinker formulasLinker;
  const_iterator it;
  FormulaArray *formulaList;
  Formulas *formulas;
  map<COLLADAFW::UniqueId,_COLLADAFW::Formula_*,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>_>
  *in_stack_ffffffffffffff68;
  ArrayPrimitiveType<COLLADAFW::Formula_*> *in_stack_ffffffffffffff70;
  FormulasLinker local_60;
  iterator local_48;
  _Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_> local_40;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_> local_30;
  FormulaArray *local_28;
  Formulas *local_10;
  
  this_00 = (Formulas *)operator_new(0x28);
  COLLADAFW::Formulas::Formulas((Formulas *)0x787166);
  local_10 = this_00;
  local_28 = COLLADAFW::Formulas::getFormulas(this_00);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<COLLADAFW::UniqueId,_COLLADAFW::Formula_*,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>_>
       ::begin(in_stack_ffffffffffffff68);
  std::_Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>::
  _Rb_tree_const_iterator(&local_30,&local_38);
  while( true ) {
    local_48._M_node =
         (_Base_ptr)
         std::
         map<COLLADAFW::UniqueId,_COLLADAFW::Formula_*,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>_>
         ::end(in_stack_ffffffffffffff68);
    std::_Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>::
    _Rb_tree_const_iterator(&local_40,&local_48);
    bVar1 = std::operator!=(&local_30,&local_40);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>::
    operator->((_Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>
                *)in_stack_ffffffffffffff70);
    COLLADAFW::ArrayPrimitiveType<COLLADAFW::Formula_*>::append
              (in_stack_ffffffffffffff70,(Formula **)in_stack_ffffffffffffff68);
    std::_Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>::
    operator++((_Rb_tree_const_iterator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>
                *)in_stack_ffffffffffffff70);
  }
  ui = in_RDI;
  FormulasLinker::FormulasLinker(&local_60,in_RDI,local_28);
  FormulasLinker::link(&local_60,(char *)ui,__to);
  iVar2 = IFilePartLoader::writer(&in_RDI->super_IFilePartLoader,(UI *)ui,uis);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xa0))
            ((long *)CONCAT44(extraout_var,iVar2),local_10);
  if (local_10 != (Formulas *)0x0) {
    (*local_10->_vptr_Formulas[1])();
  }
  FormulasLinker::~FormulasLinker(&local_60);
  return;
}

Assistant:

void PostProcessor::linkAndWriteFormulas()
	{
		COLLADAFW::Formulas* formulas = FW_NEW COLLADAFW::Formulas();
		COLLADAFW::FormulaArray& formulaList = formulas->getFormulas();

		Loader::UniqueIdFormulaMap::const_iterator it = mFormulasMap.begin();
		for (; it != mFormulasMap.end(); ++it)
		{
			formulaList.append( it->second );
		}

		FormulasLinker formulasLinker(this, formulaList);
		formulasLinker.link();

		writer()->writeFormulas(formulas);
		FW_DELETE formulas;
	}